

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlRegStrEqualWildcard(xmlChar *expStr,xmlChar *valStr)

{
  int iVar1;
  xmlChar xVar2;
  xmlChar *pxVar3;
  
  if (expStr == valStr) {
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
    if (valStr != (xmlChar *)0x0 && expStr != (xmlChar *)0x0) {
      xVar2 = *valStr;
      do {
        if (*expStr == xVar2) {
          xVar2 = valStr[1];
          pxVar3 = valStr + 1;
        }
        else {
          pxVar3 = valStr;
          if (xVar2 == '*') {
            pxVar3 = expStr;
            expStr = valStr;
          }
          xVar2 = *pxVar3;
          if (xVar2 == '\0') {
            return 0;
          }
          if (*expStr != '*') {
            return 0;
          }
          while (xVar2 != '|') {
            xVar2 = pxVar3[1];
            pxVar3 = pxVar3 + 1;
            if (xVar2 == '\0') {
              expStr = expStr + 1;
              goto LAB_0017f315;
            }
          }
          xVar2 = '|';
        }
        expStr = expStr + 1;
        valStr = pxVar3;
      } while (xVar2 != '\0');
LAB_0017f315:
      return (int)(*expStr == '\0');
    }
  }
  return iVar1;
}

Assistant:

static int
xmlRegStrEqualWildcard(const xmlChar *expStr, const xmlChar *valStr) {
    if (expStr == valStr) return(1);
    if (expStr == NULL) return(0);
    if (valStr == NULL) return(0);
    do {
	/*
	* Eval if we have a wildcard for the current item.
	*/
        if (*expStr != *valStr) {
	    /* if one of them starts with a wildcard make valStr be it */
	    if (*valStr == '*') {
	        const xmlChar *tmp;

		tmp = valStr;
		valStr = expStr;
		expStr = tmp;
	    }
	    if ((*valStr != 0) && (*expStr != 0) && (*expStr++ == '*')) {
		do {
		    if (*valStr == XML_REG_STRING_SEPARATOR)
			break;
		    valStr++;
		} while (*valStr != 0);
		continue;
	    } else
		return(0);
	}
	expStr++;
	valStr++;
    } while (*valStr != 0);
    if (*expStr != 0)
	return (0);
    else
	return (1);
}